

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall
Board::undo_move(Board *this,Point *source,Point *destination,shared_ptr<Piece> *original)

{
  long *plVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  
  pvVar2 = (this->m_board).m_data.
           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pvVar2[destination->m_x].
                    super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
  ;
  lVar4 = (long)destination->m_y * 0x10;
  plVar1 = (long *)(*(long *)(lVar3 + lVar4) + 0x18);
  *plVar1 = *plVar1 + -8;
  std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)source->m_y * 0x10 +
             *(long *)&pvVar2[source->m_x].
                       super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
             ),(__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + lVar4));
  std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)destination->m_y * 0x10 +
             *(long *)&(this->m_board).m_data.
                       super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[destination->m_x].
                       super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
             ),&original->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void Board::undo_move(const Point &source, const Point &destination, shared_ptr<Piece> original) {
    m_board[destination]->undo_last_move();
    m_board[source] = move(m_board[destination]);
    // Revive the previous piece if such exists.
    m_board[destination] = move(original);
}